

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

void CM_init_select(CMControlList cl,CManager_conflict cm)

{
  void **ppvVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  char *__s;
  CMControlList p_Var4;
  FILE *pFVar5;
  __time_t _Var6;
  CManager_conflict cm_00;
  int iVar7;
  __pid_t _Var8;
  size_t sVar9;
  char *__dest;
  void *vdlh;
  CMAddPeriodicFunc p_Var10;
  CMRemovePeriodicFunc p_Var11;
  CMPollFunc p_Var12;
  CMPollFunc p_Var13;
  void *client_data;
  CMWakeSelectFunc p_Var14;
  pthread_t pVar15;
  undefined8 *client_data_00;
  undefined1 auVar16 [16];
  timespec ts;
  timespec local_80;
  void *local_70;
  code *local_68;
  CMWakeSelectFunc local_60;
  CMAddPeriodicFunc local_58;
  CMAddSelectFunc local_50;
  CMRemoveSelectFunc local_48;
  CMAddSelectFunc local_40;
  CManager_conflict local_38;
  
  __s = cm->control_module_choice;
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar7 = CMtrace_init(cm,CMControlVerbose);
    if (iVar7 == 0) goto LAB_00116c31;
  }
  else if (CMtrace_val[1] == 0) goto LAB_00116c31;
  if (CMtrace_PID != 0) {
    pFVar5 = (FILE *)cm->CMTrace_file;
    _Var8 = getpid();
    pVar15 = pthread_self();
    fprintf(pFVar5,"P%lxT%lx - ",(long)_Var8,pVar15);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_80);
    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_80.tv_sec,local_80.tv_nsec);
  }
  fprintf((FILE *)cm->CMTrace_file,"Loading CMselect module %s\n",__s);
LAB_00116c31:
  fflush((FILE *)cm->CMTrace_file);
  CMdladdsearchdir(
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O1/thirdparty/EVPath/EVPath/lib/adios2-evpath-modules-2_10"
                  );
  CMdladdsearchdir("/usr/local/lib/adios2-evpath-modules-2_10");
  sVar9 = strlen(__s);
  __dest = (char *)INT_CMmalloc(sVar9 + 0x10);
  builtin_strncpy(__dest,"libadios2_cm",0xd);
  strcat(__dest,__s);
  sVar9 = strlen(__dest);
  builtin_strncpy(__dest + sVar9,".so",4);
  local_38 = cm;
  vdlh = CMdlopen(cm->CMTrace_file,__dest,0);
  free(__dest);
  if (vdlh == (void *)0x0) {
    CM_init_select_cold_1();
  }
  else {
    local_40 = (CMAddSelectFunc)CMdlsym(vdlh,"add_select");
    local_48 = (CMRemoveSelectFunc)CMdlsym(vdlh,"remove_select");
    local_50 = (CMAddSelectFunc)CMdlsym(vdlh,"write_select");
    p_Var10 = (CMAddPeriodicFunc)CMdlsym(vdlh,"add_periodic");
    local_58 = (CMAddPeriodicFunc)CMdlsym(vdlh,"add_delayed_task");
    p_Var11 = (CMRemovePeriodicFunc)CMdlsym(vdlh,"remove_periodic");
    local_60 = (CMWakeSelectFunc)CMdlsym(vdlh,"wake_function");
    p_Var12 = (CMPollFunc)CMdlsym(vdlh,"blocking_function");
    p_Var13 = (CMPollFunc)CMdlsym(vdlh,"polling_function");
    local_68 = (code *)CMdlsym(vdlh,"select_initialize");
    client_data = CMdlsym(vdlh,"select_shutdown");
    local_70 = CMdlsym(vdlh,"select_free");
    p_Var14 = (CMWakeSelectFunc)CMdlsym(vdlh,"select_stop");
    cm_00 = local_38;
    cl->add_select = local_40;
    cl->remove_select = local_48;
    cl->write_select = local_50;
    cl->add_periodic = p_Var10;
    cl->add_delayed_task = local_58;
    cl->remove_periodic = p_Var11;
    cl->wake_select = local_60;
    (cl->network_blocking_function).func = p_Var12;
    (cl->network_polling_function).func = p_Var13;
    cl->stop_select = p_Var14;
    ppvVar1 = &cl->select_data;
    (cl->network_blocking_function).client_data = ppvVar1;
    (cl->network_blocking_function).cm = (CManager)0x0;
    (cl->network_polling_function).client_data = ppvVar1;
    (cl->network_polling_function).cm = (CManager)0x0;
    auVar16._0_4_ = -(uint)((int)((ulong)local_40 >> 0x20) == 0 && (int)local_40 == 0);
    auVar16._4_4_ = -(uint)((int)local_48 == 0 && (int)((ulong)local_48 >> 0x20) == 0);
    auVar16._8_4_ = -(uint)((int)((ulong)p_Var12 >> 0x20) == 0 && (int)p_Var12 == 0);
    auVar16._12_4_ = -(uint)((int)p_Var10 == 0 && (int)((ulong)p_Var10 >> 0x20) == 0);
    iVar7 = movmskps((int)ppvVar1,auVar16);
    if ((iVar7 == 0) && (p_Var11 != (CMRemovePeriodicFunc)0x0)) {
      (*local_68)(&CMstatic_trans_svcs,local_38,&local_38->control_list->select_data);
      if (cl->has_thread == -1) {
        local_80.tv_sec = 0;
        iVar7 = pthread_create((pthread_t *)&local_80,(pthread_attr_t *)0x0,server_thread_func,cm_00
                              );
        _Var6 = local_80.tv_sec;
        if (local_80.tv_sec == 0 || iVar7 != 0) {
          return;
        }
        iVar7 = CMtrace_val[3];
        if (cm_00->CMTrace_file == (FILE *)0x0) {
          iVar7 = CMtrace_init(cm_00,CMLowLevelVerbose);
        }
        if (iVar7 != 0) {
          if (CMtrace_PID != 0) {
            pFVar5 = (FILE *)cm_00->CMTrace_file;
            _Var8 = getpid();
            pVar15 = pthread_self();
            fprintf(pFVar5,"P%lxT%lx - ",(long)_Var8,pVar15);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_80);
            fprintf((FILE *)cm_00->CMTrace_file,"%lld.%.9ld - ",local_80.tv_sec,local_80.tv_nsec);
          }
          fprintf((FILE *)cm_00->CMTrace_file,"CM - Forked comm thread %p\n",_Var6);
        }
        fflush((FILE *)cm_00->CMTrace_file);
        p_Var4 = cm_00->control_list;
        p_Var4->server_thread = _Var6;
        uVar2 = p_Var4->cl_reference_count;
        uVar3 = p_Var4->free_reference_count;
        p_Var4->cl_reference_count = uVar2 + 1;
        p_Var4->free_reference_count = uVar3 + 1;
        cl->has_thread = 1;
        cm_00->reference_count = cm_00->reference_count + 1;
        iVar7 = CMtrace_val[7];
        if (cm_00->CMTrace_file == (FILE *)0x0) {
          iVar7 = CMtrace_init(cm_00,CMFreeVerbose);
        }
        if (iVar7 != 0) {
          if (CMtrace_PID != 0) {
            pFVar5 = (FILE *)cm_00->CMTrace_file;
            _Var8 = getpid();
            pVar15 = pthread_self();
            fprintf(pFVar5,"P%lxT%lx - ",(long)_Var8,pVar15);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_80);
            fprintf((FILE *)cm_00->CMTrace_file,"%lld.%.9ld - ",local_80.tv_sec,local_80.tv_nsec);
          }
          fprintf((FILE *)cm_00->CMTrace_file,"Forked - CManager %p ref count now %d\n",cm_00,
                  (ulong)(uint)cm_00->reference_count);
        }
        fflush((FILE *)cm_00->CMTrace_file);
      }
      cl->select_initialized = 1;
      iVar7 = CMtrace_val[7];
      if (cm_00->CMTrace_file == (FILE *)0x0) {
        iVar7 = CMtrace_init(cm_00,CMFreeVerbose);
      }
      if (iVar7 != 0) {
        if (CMtrace_PID != 0) {
          pFVar5 = (FILE *)cm_00->CMTrace_file;
          _Var8 = getpid();
          pVar15 = pthread_self();
          fprintf(pFVar5,"P%lxT%lx - ",(long)_Var8,pVar15);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_80);
          fprintf((FILE *)cm_00->CMTrace_file,"%lld.%.9ld - ",local_80.tv_sec,local_80.tv_nsec);
        }
        fprintf((FILE *)cm_00->CMTrace_file,"CManager adding select shutdown function, %p\n",
                client_data);
      }
      fflush((FILE *)cm_00->CMTrace_file);
      internal_add_shutdown_task(cm_00,select_shutdown,client_data,1);
      client_data_00 = (undefined8 *)INT_CMmalloc(0x18);
      *client_data_00 = local_70;
      client_data_00[1] = cm_00->control_list->select_data;
      client_data_00[2] = vdlh;
      internal_add_shutdown_task(cm_00,select_free,client_data_00,2);
      return;
    }
  }
  puts("Select failed to load properly");
  exit(1);
}

Assistant:

static void
CM_init_select(CMControlList cl, CManager cm)
{
    SelectInitFunc init_function;
    SelectInitFunc shutdown_function;
    SelectInitFunc select_free_function;
    void *dlhandle = NULL;
    struct _select_item sel_item;
    char *select_module = cm->control_module_choice;
     
    CMtrace_out(cm, CMControlVerbose, "Loading CMselect module %s\n", select_module);
#if !NO_DYNAMIC_LINKING
    char *libname;
    lt_dlhandle handle;	
    lt_dladdsearchdir(EVPATH_MODULE_BUILD_DIR);
    lt_dladdsearchdir(EVPATH_MODULE_INSTALL_DIR);
    libname = malloc(strlen("lib" CM_LIBRARY_PREFIX "cm") + strlen(select_module) + strlen(MODULE_EXT) + 1);
#ifndef HAVE_WINDOWS_H
    strcpy(libname, "lib" CM_LIBRARY_PREFIX "cm");
#else
    strcpy(libname, CM_LIBRARY_PREFIX "cm");
#endif
    strcat(libname, select_module);
    strcat(libname, MODULE_EXT);
    handle = CMdlopen(cm->CMTrace_file, libname, 0);
    dlhandle = handle;
    free(libname);
    if (!handle) {
	fprintf(stderr, "Failed to load requested libcm%s dll.\n", select_module);
	fprintf(stderr, "Search path includes '.', '%s', '%s' and any default search paths supported by ld.so\n", EVPATH_MODULE_BUILD_DIR, 
		EVPATH_MODULE_INSTALL_DIR);
	fprintf(stderr, "Consider setting LD_LIBRARY_PATH or otherwise modifying module search paths.\n");
	exit(1);
    }
    sel_item.add_select = (CMAddSelectFunc)lt_dlsym(handle, "add_select");  
    sel_item.remove_select = (CMRemoveSelectFunc)lt_dlsym(handle, "remove_select");  
    sel_item.write_select = (CMAddSelectFunc)lt_dlsym(handle, "write_select");  
    sel_item.add_periodic = (CMAddPeriodicFunc)lt_dlsym(handle, "add_periodic");  
    sel_item.add_delayed_task = 
	(CMAddPeriodicFunc)lt_dlsym(handle, "add_delayed_task");  
    sel_item.remove_periodic = (CMRemovePeriodicFunc)lt_dlsym(handle, "remove_periodic");  
    sel_item.wake_function = (CMWakeSelectFunc)lt_dlsym(handle, "wake_function");
    sel_item.blocking_function = (CMPollFunc)lt_dlsym(handle, "blocking_function");
    sel_item.polling_function = (CMPollFunc)lt_dlsym(handle, "polling_function");;
    sel_item.initialize = (SelectInitFunc)lt_dlsym(handle, "select_initialize");
    sel_item.shutdown = (SelectInitFunc)lt_dlsym(handle, "select_shutdown");
    sel_item.free = (SelectInitFunc)lt_dlsym(handle, "select_free");
    sel_item.stop = (CMWakeSelectFunc)lt_dlsym(handle, "select_stop");
#else

#ifdef HAVE_SYS_EPOLL_H
    if (strcmp(select_module, "epoll") == 0) {
	libcmepoll_init_sel_item(&sel_item);
    }
#endif
    if (strcmp(select_module, "select") == 0) {
	libcmselect_init_sel_item(&sel_item);
    }

#endif
     cl->add_select = sel_item.add_select;
     cl->remove_select = sel_item.remove_select;
     cl->write_select = sel_item.write_select;
     cl->add_periodic = sel_item.add_periodic;
     cl->add_delayed_task = sel_item.add_delayed_task;
     cl->remove_periodic = sel_item.remove_periodic;
     cl->wake_select = sel_item.wake_function;
     cl->network_blocking_function.func = sel_item.blocking_function;
     cl->network_polling_function.func = sel_item.polling_function;
     init_function = sel_item.initialize;
     shutdown_function = sel_item.shutdown;
     select_free_function = sel_item.free;
     cl->stop_select = sel_item.stop;

    cl->network_blocking_function.client_data = (void*)&(cl->select_data);
    cl->network_blocking_function.cm = NULL;
    cl->network_polling_function.client_data = (void*)&(cl->select_data);
    cl->network_polling_function.cm = NULL;
     if ((cl->add_select == NULL) || (cl->remove_select == NULL) || 
	 (cl->network_blocking_function.func == NULL) || (cl->add_periodic == NULL) ||
	 (cl->remove_periodic == NULL)) {
	 printf("Select failed to load properly\n");
	 exit(1);
     }
     init_function(&CMstatic_trans_svcs, cm, &cm->control_list->select_data);
    if (cl->has_thread == -1) {
	thr_thread_t server_thread = 
	    thr_fork((void*(*)(void*))server_thread_func, 
		     (void*)cm);
	if (server_thread ==  (thr_thread_t) (intptr_t)NULL) {
	    return;
	}
	CMtrace_out(cm, CMLowLevelVerbose,
		    "CM - Forked comm thread %p\n", (void*)(intptr_t)server_thread);
	cm->control_list->server_thread = thr_get_thread_id(server_thread);
	cm->control_list->cl_reference_count++;
	cm->control_list->free_reference_count++;
	cl->has_thread = 1;
	cm->reference_count++;
	CMtrace_out(cm, CMFreeVerbose, "Forked - CManager %p ref count now %d\n", 
		    cm, cm->reference_count);
    }
     cl->select_initialized = 1;
     CMtrace_out(cm, CMFreeVerbose, "CManager adding select shutdown function, %p\n",shutdown_function);
     internal_add_shutdown_task(cm, select_shutdown, (void*)shutdown_function, SHUTDOWN_TASK);
     {
	 void ** data = malloc(3 * sizeof(void*));
	 data[0] = select_free_function;
	 data[1] = cm->control_list->select_data;
	 data[2] = dlhandle;
	 internal_add_shutdown_task(cm, select_free, (void*)data, FREE_TASK);
     }
 }